

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib552.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uStack_30;
  CURLcode ec;
  size_t i;
  data config;
  long lStack_20;
  CURLcode res;
  CURL *curl;
  char *URL_local;
  
  i._4_4_ = 0;
  i._3_1_ = 1;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib552.c"
                  ,0xb2,iVar2,uVar3);
    i._4_4_ = iVar2;
  }
  if (i._4_4_ == 0) {
    lStack_20 = curl_easy_init();
    if (lStack_20 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib552.c"
                    ,0xb3);
      i._4_4_ = 0x7c;
    }
    if ((((i._4_4_ == 0) && (i._4_4_ = curl_easy_setopt(lStack_20,0x4e7e,my_trace), i._4_4_ == 0))
        && (i._4_4_ = curl_easy_setopt(lStack_20,0x276f,(long)&i + 3), i._4_4_ == 0)) &&
       (i._4_4_ = curl_easy_setopt(lStack_20,0x29,1), i._4_4_ == 0)) {
      for (uStack_30 = 0; uStack_30 < 70000; uStack_30 = uStack_30 + 1) {
        databuf[uStack_30] = "test data"[uStack_30 % 10];
      }
      i._4_4_ = curl_easy_setopt(lStack_20,0x2f,1);
      if (((((i._4_4_ == 0) && (i._4_4_ = curl_easy_setopt(lStack_20,0x3c,70000), i._4_4_ == 0)) &&
           ((i._4_4_ = curl_easy_setopt(lStack_20,0x4e2c,read_callback), i._4_4_ == 0 &&
            ((i._4_4_ = curl_easy_setopt(lStack_20,0x4e2b,write_callback), i._4_4_ == 0 &&
             (i._4_4_ = curl_easy_setopt(lStack_20,0x4ea2,ioctl_callback), i._4_4_ == 0)))))) &&
          (i._4_4_ = curl_easy_setopt(lStack_20,0x2714,libtest_arg2), i._4_4_ == 0)) &&
         ((i._4_4_ = curl_easy_setopt(lStack_20,0x2712,URL), i._4_4_ == 0 &&
          (i._4_4_ = curl_easy_setopt(lStack_20,0x6f,0xffffffffffffffef), i._4_4_ == 0)))) {
        i._4_4_ = curl_easy_perform(lStack_20);
        curl_mfprintf(_stderr,"curl_easy_perform = %d\n",i._4_4_);
      }
    }
    curl_easy_cleanup(lStack_20);
    curl_global_cleanup();
    URL_local._4_4_ = i._4_4_;
  }
  else {
    URL_local._4_4_ = i._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;
  struct data config;
  size_t i;
  static const char fill[] = "test data";

  config.trace_ascii = 1; /* enable ascii tracing */

  global_init(CURL_GLOBAL_ALL);
  easy_init(curl);

  test_setopt(curl, CURLOPT_DEBUGFUNCTION, my_trace);
  test_setopt(curl, CURLOPT_DEBUGDATA, &config);
  /* the DEBUGFUNCTION has no effect until we enable VERBOSE */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* setup repeated data string */
  for(i = 0; i < sizeof(databuf); ++i)
      databuf[i] = fill[i % sizeof fill];

  /* Post */
  test_setopt(curl, CURLOPT_POST, 1L);

#ifdef CURL_DOES_CONVERSIONS
  /* Convert the POST data to ASCII */
  test_setopt(curl, CURLOPT_TRANSFERTEXT, 1L);
#endif

  /* Setup read callback */
  test_setopt(curl, CURLOPT_POSTFIELDSIZE, (long) sizeof(databuf));
  test_setopt(curl, CURLOPT_READFUNCTION, read_callback);

  /* Write callback */
  test_setopt(curl, CURLOPT_WRITEFUNCTION, write_callback);

  /* Ioctl function */
  test_setopt(curl, CURLOPT_IOCTLFUNCTION, ioctl_callback);

  test_setopt(curl, CURLOPT_PROXY, libtest_arg2);

  test_setopt(curl, CURLOPT_URL, URL);

  /* Accept any auth. But for this bug configure proxy with DIGEST, basic
     might work too, not NTLM */
  test_setopt(curl, CURLOPT_PROXYAUTH, (long)CURLAUTH_ANY);

  res = curl_easy_perform(curl);
  fprintf(stderr, "curl_easy_perform = %d\n", (int)res);

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();
  return (int)res;
}